

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O0

void __thiscall kj::std::anon_unknown_0::TestCase75::run(TestCase75 *this)

{
  bool bVar1;
  int iVar2;
  size_t in_RCX;
  Type *func;
  bool local_359;
  bool _kj_shouldLog;
  Fault f;
  undefined1 local_340 [8];
  Maybe<kj::Exception> e;
  char buf [9];
  void *bytes;
  StdOutputStream out;
  undefined1 local_1a8 [8];
  StdInputStream in;
  stringstream ss;
  ostream local_188 [376];
  TestCase75 *local_10;
  TestCase75 *this_local;
  
  local_10 = this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&in.stream_);
  StdInputStream::StdInputStream((StdInputStream *)local_1a8,(istream *)&in.stream_);
  StdOutputStream::StdOutputStream((StdOutputStream *)&bytes,local_188);
  StdOutputStream::write((StdOutputStream *)&bytes,0x259812,(void *)0x6,in_RCX);
  f.exception = (Exception *)local_1a8;
  runCatchingExceptions<kj::std::(anonymous_namespace)::TestCase75::run()::__0>
            ((Maybe<kj::Exception> *)local_340,(kj *)&f,func);
  bVar1 = Maybe<kj::Exception>::operator==((Maybe<kj::Exception> *)local_340,(void *)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    iVar2 = strcmp("foobar",(char *)((long)&e.ptr.field_1 + 0x157));
    if (iVar2 != 0) {
      local_359 = _::Debug::shouldLog(ERROR);
      while (local_359 != false) {
        _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[9]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
                   ,0x62,ERROR,
                   "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
                   (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
                   (char (*) [7])"foobar",(char (*) [9])((long)&e.ptr.field_1 + 0x157));
        local_359 = false;
      }
    }
    Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_340);
    StdOutputStream::~StdOutputStream((StdOutputStream *)&bytes);
    StdInputStream::~StdInputStream((StdInputStream *)local_1a8);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&in.stream_);
    return;
  }
  _::Debug::Fault::Fault
            ((Fault *)&stack0xfffffffffffffca8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
             ,0x5f,FAILED,"!(e == nullptr)","");
  _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffca8);
}

Assistant:

TEST(StdIoStream, ReadToEndOfFile) {
  // Check that read throws an exception when eof is reached before specified
  // bytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  const void* bytes = "foobar";

  out.write(bytes, 6);

  char buf[9];

  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    in.read(buf, 8, 8);
  });
  buf[6] = '\0';

  ASSERT_FALSE(e == nullptr);

  // Ensure that the value is still read up to the EOF.
  EXPECT_STREQ("foobar", buf);
}